

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O0

int search(ion_bpp_handle_t handle,ion_bpp_buffer_t *buf,void *key,ion_bpp_external_address_t rec,
          ion_bpp_key_t **mkey,ion_bpp_mode_e mode)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int local_58;
  ion_bpp_bool_t foundDup;
  int ub;
  int lb;
  int m;
  int cc;
  ion_bpp_h_node_t *h;
  ion_bpp_mode_e mode_local;
  ion_bpp_key_t **mkey_local;
  ion_bpp_external_address_t rec_local;
  void *key_local;
  ion_bpp_buffer_t *buf_local;
  ion_bpp_handle_t handle_local;
  
  bVar1 = false;
  foundDup = boolean_false;
  local_58 = (*(ushort *)buf->p >> 1) - 1;
  while( true ) {
    while( true ) {
      while( true ) {
        if (local_58 < (int)foundDup) {
          if (*(ushort *)buf->p >> 1 == 0) {
            *mkey = &buf->p->fkey;
            handle_local._4_4_ = -1;
          }
          else if (((*(int *)((long)handle + 0xc) == 0) || (mode != MODE_FIRST)) || (!bVar1)) {
            if (mode == MODE_LLEQ) {
              *mkey = &buf->p->fkey + (local_58 + 1) * *(int *)((long)handle + 0xbc);
              cVar2 = (**(code **)((long)handle + 0x18))
                                (key,*mkey,*(undefined4 *)((long)handle + 8));
              lb = (int)cVar2;
              if ((local_58 == (*(ushort *)buf->p >> 1) - 1) || ((local_58 != -1 && (lb < 1)))) {
                *mkey = &buf->p->fkey + local_58 * *(int *)((long)handle + 0xbc);
                cVar2 = (**(code **)((long)handle + 0x18))
                                  (key,*mkey,*(undefined4 *)((long)handle + 8));
                lb = (int)cVar2;
              }
              handle_local._4_4_ = lb;
            }
            else if (mode == MODE_FGEQ) {
              *mkey = &buf->p->fkey + (int)(foundDup * *(int *)((long)handle + 0xbc));
              cVar2 = (**(code **)((long)handle + 0x18))
                                (key,*mkey,*(undefined4 *)((long)handle + 8));
              lb = (int)cVar2;
              if (((int)foundDup < (int)((*(ushort *)buf->p >> 1) - 1)) && (lb < 0)) {
                *mkey = &buf->p->fkey +
                        (int)((foundDup + boolean_true) * *(int *)((long)handle + 0xbc));
                cVar2 = (**(code **)((long)handle + 0x18))
                                  (key,*mkey,*(undefined4 *)((long)handle + 8));
                lb = (int)cVar2;
              }
              handle_local._4_4_ = lb;
            }
            else {
              handle_local._4_4_ = lb;
            }
          }
          else {
            *mkey = *mkey + *(int *)((long)handle + 0xbc);
            handle_local._4_4_ = 0;
          }
          return handle_local._4_4_;
        }
        iVar3 = (int)(foundDup + local_58) / 2;
        *mkey = &buf->p->fkey + iVar3 * *(int *)((long)handle + 0xbc);
        cVar2 = (**(code **)((long)handle + 0x18))(key,*mkey,*(undefined4 *)((long)handle + 8));
        lb = (int)cVar2;
        if ((-1 < lb) && ((lb != 0 || (mode != MODE_FGEQ)))) break;
        local_58 = iVar3 + -1;
      }
      if ((lb < 1) && ((lb != 0 || (mode != MODE_LLEQ)))) break;
      foundDup = iVar3 + boolean_true;
    }
    if (*(int *)((long)handle + 0xc) == 0) break;
    if (mode == MODE_FIRST) {
      local_58 = iVar3 + -1;
      if (local_58 < (int)foundDup) {
        return 0;
      }
      bVar1 = true;
    }
    else if (mode == MODE_MATCH) {
      if (rec < *(long *)(*mkey + *(int *)((long)handle + 8))) {
        local_58 = iVar3 + -1;
        lb = -1;
      }
      else {
        if (rec <= *(long *)(*mkey + *(int *)((long)handle + 8))) {
          return 0;
        }
        foundDup = iVar3 + boolean_true;
        lb = 1;
      }
    }
  }
  return lb;
}

Assistant:

static int
search(
	ion_bpp_handle_t			handle,
	ion_bpp_buffer_t			*buf,
	void						*key,
	ion_bpp_external_address_t	rec,
	ion_bpp_key_t				**mkey,
	ion_bpp_mode_e				mode
) {
	/*
	 * input:
	 *   p					  pointer to node
	 *   key					key to find
	 *   rec					record address (dupkey only)
	 * output:
	 *   k					  pointer to ion_bpp_key_t info
	 * returns:
	 *   CC_EQ				  key = mkey
	 *   CC_LT				  key < mkey
	 *   CC_GT				  key > mkey
	*/
	ion_bpp_h_node_t	*h = handle;
	int					cc;		/* condition code */
	int					m;		/* midpoint of search */
	int					lb;		/* lower-bound of binary search */
	int					ub;		/* upper-bound of binary search */
	ion_bpp_bool_t		foundDup;			/* true if found a duplicate key */

	/* scan current node for key using binary search */
	foundDup	= boolean_false;
	lb			= 0;
	ub			= ct(buf) - 1;

	while (lb <= ub) {
		m		= (lb + ub) / 2;
		*mkey	= fkey(buf) + ks(m);
		cc		= h->comp(key, key(*mkey), (ion_key_size_t) (h->keySize));

		if ((cc < 0) || ((cc == 0) && (MODE_FGEQ == mode))) {
			/* key less than key[m] */
			ub = m - 1;
		}
		else if ((cc > 0) || ((cc == 0) && (MODE_LLEQ == mode))) {
			/* key greater than key[m] */
			lb = m + 1;
		}
		else {
			/* keys match */
			if (h->dupKeys) {
				switch (mode) {
					case MODE_FIRST:
						/* backtrack to first key */
						ub = m - 1;

						if (lb > ub) {
							return ION_CC_EQ;
						}

						foundDup = boolean_true;
						break;

					case MODE_MATCH:

						/* rec's must also match */
						if (rec < rec(*mkey)) {
							ub	= m - 1;
							cc	= ION_CC_LT;
						}
						else if (rec > rec(*mkey)) {
							lb	= m + 1;
							cc	= ION_CC_GT;
						}
						else {
							return ION_CC_EQ;
						}

						break;

					case MODE_FGEQ:
					case MODE_LLEQ:	/* nop */
						break;
				}
			}
			else {
				return cc;
			}
		}
	}

	if (ct(buf) == 0) {
		/* empty list */
		*mkey = fkey(buf);
		return ION_CC_LT;
	}

	if (h->dupKeys && (mode == MODE_FIRST) && foundDup) {
		/* next key is first key in set of duplicates */
		*mkey += ks(1);
		return ION_CC_EQ;
	}

	if (MODE_LLEQ == mode) {
		*mkey	= fkey(buf) + ks(ub + 1);
		cc		= h->comp(key, key(*mkey), (ion_key_size_t) (h->keySize));

		if ((ub == ct(buf) - 1) || ((ub != -1) && (cc <= 0))) {
			*mkey	= fkey(buf) + ks(ub);
			cc		= h->comp(key, key(*mkey), (ion_key_size_t) (h->keySize));
		}

		return cc;
	}

	if (MODE_FGEQ == mode) {
		*mkey	= fkey(buf) + ks(lb);
		cc		= h->comp(key, key(*mkey), (ion_key_size_t) (h->keySize));

		if ((lb < ct(buf) - 1) && (cc < 0)) {
			*mkey	= fkey(buf) + ks(lb + 1);
			cc		= h->comp(key, key(*mkey), (ion_key_size_t) (h->keySize));
		}

		return cc;
	}

	/* didn't find key */
	return cc;
}